

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O0

void __thiscall
google::anon_unknown_0::MinimalFormatter::AppendString(MinimalFormatter *this,char *str)

{
  bool bVar1;
  long local_20;
  ptrdiff_t i;
  char *str_local;
  MinimalFormatter *this_local;
  
  local_20 = 0;
  while( true ) {
    bVar1 = false;
    if (str[local_20] != '\0') {
      bVar1 = this->cursor_ + local_20 < this->end_;
    }
    if (!bVar1) break;
    this->cursor_[local_20] = str[local_20];
    local_20 = local_20 + 1;
  }
  this->cursor_ = this->cursor_ + local_20;
  return;
}

Assistant:

void AppendString(const char* str) {
    ptrdiff_t i = 0;
    while (str[i] != '\0' && cursor_ + i < end_) {
      cursor_[i] = str[i];
      ++i;
    }
    cursor_ += i;
  }